

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O2

void NES_APU_np_FrameSequence(void *chip,int s)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  NES_APU *apu;
  
  if (s < 4) {
    for (lVar3 = 0x13c; lVar3 != 0x13e; lVar3 = lVar3 + 1) {
      if (*(char *)((long)chip + lVar3) == '\x01') {
        *(undefined1 *)((long)chip + lVar3) = 0;
        *(undefined4 *)((long)chip + lVar3 * 4 + -0x3a0) = 0xf;
        *(undefined4 *)((long)chip + lVar3 * 4 + -0x3a8) = 0;
      }
      else {
        iVar2 = *(int *)((long)chip + lVar3 * 4 + -0x3a8);
        iVar1 = *(int *)((long)chip + lVar3 * 4 + -0x3b0);
        iVar4 = iVar2 + 1;
        if (iVar1 <= iVar2) {
          iVar4 = 0;
        }
        *(int *)((long)chip + lVar3 * 4 + -0x3a8) = iVar4;
        if (iVar1 <= iVar2) {
          iVar4 = *(int *)((long)chip + lVar3 * 4 + -0x3a0);
          if ((iVar4 == 0 & *(byte *)((long)chip + lVar3 + -2)) == 1) {
            *(undefined4 *)((long)chip + lVar3 * 4 + -0x3a0) = 0xf;
          }
          else if (0 < iVar4) {
            *(int *)((long)chip + lVar3 * 4 + -0x3a0) = iVar4 + -1;
          }
        }
      }
    }
    if ((s & 1U) == 0) {
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        if ((*(char *)((long)chip + lVar3 + 0x13a) == '\0') &&
           (iVar4 = *(int *)((long)chip + lVar3 * 4 + 0x158), 0 < iVar4)) {
          *(int *)((long)chip + lVar3 * 4 + 0x158) = iVar4 + -1;
        }
        if (*(char *)((long)chip + lVar3 + 0x118) == '\x01') {
          iVar4 = *(int *)((long)chip + lVar3 * 4 + 0x128);
          *(int *)((long)chip + lVar3 * 4 + 0x128) = iVar4 + -1;
          if (iVar4 < 2) {
            sweep_sqr((NES_APU *)chip,(int)lVar3);
            if (((7 < *(int *)((long)chip + lVar3 * 4 + 0x108)) &&
                (iVar4 = *(int *)((long)chip + lVar3 * 4 + 0x110), iVar4 < 0x800)) &&
               (0 < *(int *)((long)chip + lVar3 * 4 + 0x130))) {
              if (iVar4 < 1) {
                iVar4 = 0;
              }
              *(int *)((long)chip + lVar3 * 4 + 0x108) = iVar4;
            }
            *(int *)((long)chip + lVar3 * 4 + 0x128) = *(int *)((long)chip + lVar3 * 4 + 0x120) + 1;
          }
          if (*(char *)((long)chip + lVar3 + 0x11c) == '\x01') {
            *(int *)((long)chip + lVar3 * 4 + 0x128) = *(int *)((long)chip + lVar3 * 4 + 0x120) + 1;
            *(undefined1 *)((long)chip + lVar3 + 0x11c) = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void NES_APU_np_FrameSequence(void* chip, int s)
{
	NES_APU* apu = (NES_APU*)chip;
	int i;

	//DEBUG_OUT("FrameSequence(%d)\n",s);

	if (s > 3) return; // no operation in step 4

	// 240hz clock
	for (i=0; i < 2; ++i)
	{
		bool divider = false;
		if (apu->envelope_write[i])
		{
			apu->envelope_write[i] = false;
			apu->envelope_counter[i] = 15;
			apu->envelope_div[i] = 0;
		}
		else
		{
			++apu->envelope_div[i];
			if (apu->envelope_div[i] > apu->envelope_div_period[i])
			{
				divider = true;
				apu->envelope_div[i] = 0;
			}
		}
		if (divider)
		{
			if (apu->envelope_loop[i] && apu->envelope_counter[i] == 0)
				apu->envelope_counter[i] = 15;
			else if (apu->envelope_counter[i] > 0)
				--apu->envelope_counter[i];
		}
	}

	// 120hz clock
	if ((s&1) == 0)
	  for (i=0; i < 2; ++i)
	  {
		if (!apu->envelope_loop[i] && (apu->length_counter[i] > 0))
			--apu->length_counter[i];

		if (apu->sweep_enable[i])
		{
			//DEBUG_OUT("Clock sweep: %d\n", i);

			--apu->sweep_div[i];
			if (apu->sweep_div[i] <= 0)
			{
				sweep_sqr(apu, i);	// calculate new sweep target

				//DEBUG_OUT("sweep_div[%d] (0/%d)\n",i,apu->sweep_div_period[i]);
				//DEBUG_OUT("freq[%d]=%d > sfreq[%d]=%d\n",i,apu->freq[i],i,apu->sfreq[i]);

				if (apu->freq[i] >= 8 && apu->sfreq[i] < 0x800 && apu->sweep_amount[i] > 0) // update frequency if appropriate
				{
					apu->freq[i] = apu->sfreq[i] < 0 ? 0 : apu->sfreq[i];
				}
				apu->sweep_div[i] = apu->sweep_div_period[i] + 1;

				//DEBUG_OUT("freq[%d]=%d\n",i,apu->freq[i]);
			}

			if (apu->sweep_write[i])
			{
				apu->sweep_div[i] = apu->sweep_div_period[i] + 1;
				apu->sweep_write[i] = false;
			}
		}
	  }

}